

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeDumper.cpp
# Opt level: O3

void Js::ByteCodeDumper::
     DumpElementSlotI3<Js::OpLayoutT_ElementSlotI3<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
               (OpCode op,OpLayoutT_ElementSlotI3<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *data,
               FunctionBody *dumpFunction,ByteCodeReader *reader)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  code *pcVar4;
  bool bVar5;
  int iVar6;
  FunctionProxy *this;
  ParseableFunctionInfo *pPVar7;
  undefined4 extraout_var;
  undefined4 *puVar8;
  undefined6 in_register_0000003a;
  
  if (((uint)CONCAT62(in_register_0000003a,op) & 0xfffffffe) == 0x16a) {
    this = ParseableFunctionInfo::GetNestedFunctionProxy
                     (&dumpFunction->super_ParseableFunctionInfo,data->SlotIndex);
    uVar1 = data->Value;
    uVar2 = data->Instance;
    uVar3 = data->HomeObj;
    pPVar7 = FunctionProxy::EnsureDeserialized(this);
    iVar6 = (*(pPVar7->super_FunctionProxy).super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[7])(pPVar7);
    Output::Print(L" R%d = env:R%d hmo: R%d, %s()",(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,
                  CONCAT44(extraout_var,iVar6));
    return;
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  *puVar8 = 1;
  bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeDumper.cpp"
                              ,0x3c9,"(false)","Unknown OpCode for OpLayoutElementSlotI3");
  if (bVar5) {
    *puVar8 = 0;
    return;
  }
  pcVar4 = (code *)invalidInstructionException();
  (*pcVar4)();
}

Assistant:

void ByteCodeDumper::DumpElementSlotI3(OpCode op, const unaligned T * data, Js::FunctionBody * dumpFunction, ByteCodeReader& reader)
    {
        switch (op)
        {
        case OpCode::NewInnerScFuncHomeObj:
        case OpCode::NewInnerScGenFuncHomeObj:
        {
            FunctionProxy* pfuncActual = dumpFunction->GetNestedFunctionProxy((uint)data->SlotIndex);
            Output::Print(_u(" R%d = env:R%d hmo: R%d, %s()"), data->Value, data->Instance, data->HomeObj,
                pfuncActual->EnsureDeserialized()->GetDisplayName());
            break;
        }
        default:
        {
            AssertMsg(false, "Unknown OpCode for OpLayoutElementSlotI3");
            break;
        }
        }
    }